

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O0

size_t __thiscall
CVmObjClass::list_class_props
          (CVmObjClass *this,vm_obj_id_t self,vm_meta_entry_t *entry,CVmObjList *lst,
          size_t starting_idx,int static_only)

{
  int iVar1;
  long in_RCX;
  vm_meta_entry_t *in_RDX;
  int in_ESI;
  long *in_RDI;
  long in_R8;
  int in_R9D;
  vm_obj_id_t source_obj;
  vm_val_t val;
  vm_prop_id_t prop;
  size_t idx;
  size_t cnt;
  ushort i;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  vm_val_t local_58;
  vm_prop_id_t local_42;
  long local_40;
  size_t local_38;
  ushort local_2e;
  int local_2c;
  long local_20;
  vm_meta_entry_t *local_18;
  int local_c;
  
  local_2e = 1;
  local_38 = 0;
  local_40 = in_R8;
  local_2c = in_R9D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  do {
    if (local_18->func_xlat_cnt_ < (ulong)local_2e) {
      return local_38;
    }
    local_42 = vm_meta_entry_t::xlat_func(local_18,local_2e);
    if (local_42 != 0) {
      if (local_2c != 0) {
        iVar1 = (**(code **)(*in_RDI + 0x68))
                          (in_RDI,local_42,&local_58,local_c,&stack0xffffffffffffffa4,0);
        if ((iVar1 == 0) || (in_stack_ffffffffffffffa4 != local_c)) goto LAB_003649ca;
      }
      if (local_20 != 0) {
        vm_val_t::set_propid(&local_58,local_42);
        CVmObjList::cons_set_element
                  ((CVmObjList *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (size_t)in_RDI,(vm_val_t *)0x3649ae);
        local_40 = local_40 + 1;
      }
      local_38 = local_38 + 1;
    }
LAB_003649ca:
    local_2e = local_2e + 1;
  } while( true );
}

Assistant:

size_t CVmObjClass::list_class_props(VMG_ vm_obj_id_t self,
                                      vm_meta_entry_t *entry,
                                      CVmObjList *lst, size_t starting_idx,
                                      int static_only)
{
    ushort i;
    size_t cnt;
    size_t idx;
    
    /* count the valid entries */
    for (i = 1, idx = starting_idx, cnt = 0 ;
         i <= entry->func_xlat_cnt_ ; ++i)
    {
        vm_prop_id_t prop;
        vm_val_t val;
        vm_obj_id_t source_obj;

        /* get this property */
        prop = entry->xlat_func(i);
        
        /* 
         *   If this one's valid, check to see if it's we're interested in
         *   it.  If we want only statics, include it only if it's
         *   implemented as a static method on this intrinsic class object;
         *   otherwise, include it unconditionally.
         *   
         *   To determine if the property is implemented as a static, call
         *   the property on self without an argc pointer - this is the
         *   special form of the call which merely retrieves the value of the
         *   property without evaluating it.  If the property is defined on
         *   the object, and the source of the definition is self, include
         *   this one in the list of directly-defined properties.  
         */
        if (prop != VM_INVALID_PROP
            && (!static_only
                || (get_prop(vmg_ prop, &val, self, &source_obj, 0)
                    && source_obj == self)))
        {
            /* we're interested - add it to the list if we have one */
            if (lst != 0)
            {
                /* set up a value containing the property pointer */
                val.set_propid(prop);

                /* add it to the list at the next free slot */
                lst->cons_set_element(idx, &val);

                /* advance to the next slot */
                ++idx;
            }

            /* count it */
            ++cnt;
        }
    }

    /* return the number of properties we found */
    return cnt;
}